

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O3

void RegexTree::display_node(tree_node *ptr,ostream *os)

{
  ostream *poVar1;
  char *pcVar2;
  char local_12;
  char local_11;
  
  if (ptr != (tree_node *)0x0) {
    if ((ptr->left == (tree_node *)0x0) && (ptr->right == (tree_node *)0x0)) {
      pcVar2 = &local_12;
    }
    else {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_11,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
      display_node(ptr->left,os);
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      display_node(ptr->right,os);
      pcVar2 = ")";
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,1);
  }
  return;
}

Assistant:

void RegexTree::display_node(const tree_node *ptr, std::ostream &os) {
    if (ptr == nullptr)
        return;
    else if (ptr->left == nullptr && ptr->right == nullptr) {
        os << show_control(ptr->c);
        return;
    }

    char toshow = show_control(ptr->c);
    os << toshow << "(";
    display_node(ptr->left, os);
    os << ", ";
    display_node(ptr->right, os);
    os << ")";
}